

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::str_writer<char>>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>
           *this,align_spec *spec,str_writer<char> *f)

{
  byte bVar1;
  uint uVar2;
  long *plVar3;
  long lVar4;
  size_t sVar5;
  size_t __n;
  size_t size;
  void *pvVar6;
  void *__dest;
  char __tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  ulong uVar7;
  ptrdiff_t _Num_2;
  size_t __len;
  size_t __n_00;
  
  uVar2 = spec->width_;
  uVar7 = f->size_;
  plVar3 = *(long **)this;
  lVar4 = plVar3[1];
  __n_00 = uVar2 - uVar7;
  if (uVar2 < uVar7 || __n_00 == 0) {
    std::__cxx11::string::resize((ulong)plVar3,(char)uVar7 + (char)lVar4);
    __n = f->size_;
    if (__n == 0) {
      return;
    }
    pvVar6 = (void *)(lVar4 + *plVar3);
LAB_0011aa8a:
    memmove(pvVar6,f->s,__n);
    return;
  }
  std::__cxx11::string::resize((ulong)plVar3,(char)uVar2 + (char)lVar4);
  pvVar6 = (void *)(lVar4 + *plVar3);
  bVar1 = (byte)spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    uVar7 = __n_00 >> 1;
    __dest = pvVar6;
    if (1 < __n_00) {
      __dest = (void *)((long)pvVar6 + uVar7);
      memset(pvVar6,(uint)bVar1,uVar7);
    }
    sVar5 = f->size_;
    if (sVar5 != 0) {
      memmove(__dest,f->s,sVar5);
    }
    __n_00 = __n_00 - uVar7;
    pvVar6 = (void *)((long)__dest + sVar5);
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      memset(pvVar6,(uint)bVar1,__n_00);
      __n = f->size_;
      if (__n == 0) {
        return;
      }
      pvVar6 = (void *)((long)pvVar6 + __n_00);
      goto LAB_0011aa8a;
    }
    sVar5 = f->size_;
    if (sVar5 != 0) {
      memmove(pvVar6,f->s,sVar5);
    }
    pvVar6 = (void *)((long)pvVar6 + sVar5);
  }
  memset(pvVar6,(uint)bVar1,__n_00);
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }